

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void ppc_cpu_reset(CPUState *dev)

{
  uint uVar1;
  ulong uVar2;
  TranslationBlock *pTVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  TranslationBlock *pTVar7;
  
  (*(code *)dev[3].tb_jmp_cache[0xa5e])();
  uVar2 = 0x1000000000000000;
  if ((*(byte *)((long)dev[3].tb_jmp_cache + 0x46c2) & 1) != 0) {
    uVar2 = 0x9000000000000000;
  }
  pTVar3 = (TranslationBlock *)((uVar2 | 0x40) & (ulong)dev[3].tb_jmp_cache[0x8d7]);
  pTVar7 = (TranslationBlock *)((ulong)pTVar3 & 0x8000000000000040);
  if (((ulong)dev[1].tb_jmp_cache[0x3a9] >> 0x3c & 1) != 0) {
    pTVar7 = pTVar3;
  }
  if (((ulong)dev[1].tb_jmp_cache[0x3a9] & 0x30) != 0) {
    (*cpu_interrupt_handler)(dev,4);
  }
  if ((((ulong)dev[3].tb_jmp_cache[0x8d8] & 8) != 0) &&
     ((*(byte *)((long)dev[1].tb_jmp_cache + 0x1d4b) & 0x10) != 0)) {
    (*cpu_interrupt_handler)(dev,4);
  }
  if ((((ulong)dev[3].tb_jmp_cache[0x8da] & 4) != 0) &&
     ((*(byte *)((long)dev[1].tb_jmp_cache + 0x1d4a) & 2) != 0)) {
    hreg_swap_gpr_tgpr((CPUPPCState_conflict2 *)(dev[1].tb_jmp_cache + 0x359));
  }
  uVar2 = (ulong)pTVar7 >> 6 & 0xffffffff;
  if (uVar2 != ((*(uint *)(dev[1].tb_jmp_cache + 0x3a9) >> 6 & 1) != 0)) {
    dev[3].tb_jmp_cache[0x946] = (TranslationBlock *)(uVar2 * 0xfff00000);
  }
  dev[1].tb_jmp_cache[0x3a9] = pTVar7;
  pTVar3 = dev[3].tb_jmp_cache[0x8d8];
  *(undefined4 *)((long)dev[3].tb_jmp_cache + 0x4a74) = 1;
  if (((ulong)pTVar3 & 8) == 0) {
    *(undefined4 *)((long)dev[3].tb_jmp_cache + 0x4a74) = 3;
    uVar1 = (uint)((ulong)pTVar7 >> 0x3a) & 4 | 3;
    *(uint *)(dev[3].tb_jmp_cache + 0x94e) = uVar1;
  }
  else {
    dev[3].tb_jmp_cache[0x94e] = (TranslationBlock *)0x100000001;
    uVar1 = 1;
  }
  *(uint *)((long)dev[3].tb_jmp_cache + 0x4a74) = uVar1;
  dev[3].tb_jmp_cache[0x94c] =
       (TranslationBlock *)((ulong)pTVar7 & 0x9000000000000000 | (ulong)dev[3].tb_jmp_cache[0x94d]);
  dev[1].tb_jmp_cache[0x3ae] =
       (TranslationBlock *)((ulong)dev[3].tb_jmp_cache[0x946] | (ulong)dev[3].tb_jmp_cache[0x949]);
  if (*(int *)(dev[3].tb_jmp_cache + 0x8d8) != 6) {
    ppc_tlb_invalidate_all_ppc64((CPUPPCState_conflict2 *)(dev[1].tb_jmp_cache + 0x359));
  }
  pTVar7 = dev[1].tb_jmp_cache[0x3a9];
  uVar1 = (uint)pTVar7;
  uVar6 = (uint)((uVar1 >> 0xe & 1) == 0);
  uVar5 = (uint)((ulong)pTVar7 >> 4) & 2 | uVar6;
  pTVar3 = dev[3].tb_jmp_cache[0x8d8];
  *(uint *)((long)dev[3].tb_jmp_cache + 0x4a74) = uVar6;
  if (((ulong)pTVar3 & 8) == 0) {
    uVar5 = uVar5 ^ 2;
    *(uint *)(dev[3].tb_jmp_cache + 0x94e) = uVar5;
    uVar6 = ((uint)((ulong)pTVar7 >> 3) & 2 | uVar6) ^ 2;
    *(uint *)((long)dev[3].tb_jmp_cache + 0x4a74) = uVar6;
    uVar1 = (uint)((ulong)pTVar7 >> 0x20);
  }
  else {
    *(uint *)(dev[3].tb_jmp_cache + 0x94e) = uVar5;
    uVar6 = (uint)((ulong)pTVar7 >> 3) & 2 | uVar6;
    *(uint *)((long)dev[3].tb_jmp_cache + 0x4a74) = uVar6;
  }
  uVar1 = uVar1 >> 0x1a & 4;
  *(uint *)(dev[3].tb_jmp_cache + 0x94e) = uVar5 | uVar1;
  *(uint *)((long)dev[3].tb_jmp_cache + 0x4a74) = uVar1 | uVar6;
  dev[3].tb_jmp_cache[0x94c] =
       (TranslationBlock *)
       ((ulong)dev[1].tb_jmp_cache[0x3a9] & 0x9000000082c06631 | (ulong)dev[3].tb_jmp_cache[0x94d]);
  dev[1].tb_jmp_cache[0x3a6] = (TranslationBlock *)0xffffffffffffffff;
  dev->exception_index = -1;
  dev[3].tb_jmp_cache[0x8dd] = (TranslationBlock *)0x0;
  ppc_irq_reset_ppc64((PowerPCCPU_conflict3 *)dev);
  *(undefined1 *)((long)dev[3].tb_jmp_cache + 0x468c) = 1;
  lVar4 = 0;
  do {
    if (dev[1].tb_jmp_cache[lVar4 + 0x8c2] != (TranslationBlock *)0x0) {
      *(TranslationBlock **)((long)dev[1].tb_jmp_cache + lVar4 + 0x25e0) =
           dev[1].tb_jmp_cache[lVar4 + 0x8c3];
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x2000);
  return;
}

Assistant:

static void ppc_cpu_reset(CPUState *dev)
{
    CPUState *s = CPU(dev);
    PowerPCCPU *cpu = POWERPC_CPU(s);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong msr;
    int i;

    pcc->parent_reset(dev);

    msr = (target_ulong)0;
    msr |= (target_ulong)MSR_HVB;
    msr |= (target_ulong)0 << MSR_AP; /* TO BE CHECKED */
    msr |= (target_ulong)0 << MSR_SA; /* TO BE CHECKED */
    msr |= (target_ulong)1 << MSR_EP;
#if defined(DO_SINGLE_STEP) && 0
    /* Single step trace mode */
    msr |= (target_ulong)1 << MSR_SE;
    msr |= (target_ulong)1 << MSR_BE;
#endif

#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        msr |= (1ULL << MSR_SF);
    }
#endif

    hreg_store_msr(env, msr, 1);

    env->nip = env->hreset_vector | env->excp_prefix;
    if (env->mmu_model != POWERPC_MMU_REAL) {
        ppc_tlb_invalidate_all(env);
    }

    hreg_compute_hflags(env);
#ifdef _MSC_VER
    env->reserve_addr = (target_ulong)(0ULL - 1ULL);
#else
    env->reserve_addr = (target_ulong)-1ULL;
#endif
    /* Be sure no exception or interrupt is pending */
    env->pending_interrupts = 0;
    s->exception_index = POWERPC_EXCP_NONE;
    env->error_code = 0;
    ppc_irq_reset(cpu);

    /* tininess for underflow is detected before rounding */
    set_float_detect_tininess(float_tininess_before_rounding,
                              &env->fp_status);

    for (i = 0; i < ARRAY_SIZE(env->spr_cb); i++) {
        ppc_spr_t *spr = &env->spr_cb[i];

        if (!spr->name) {
            continue;
        }
        env->spr[i] = spr->default_value;
    }
}